

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O2

bool __thiscall SQGenerator::Resume(SQGenerator *this,SQVM *v,SQObjectPtr *dest)

{
  SQUnsignedInteger *pSVar1;
  SQExceptionTrap *pSVar2;
  SQUnsignedInteger SVar3;
  CallInfo *pCVar4;
  SQExceptionTrap *pSVar5;
  SQUnsignedInteger SVar6;
  SQObjectPtr *pSVar7;
  long lVar8;
  bool bVar9;
  int iVar10;
  char *s;
  SQObject *obj;
  long lVar11;
  SQInteger n;
  ulong uVar12;
  long lVar13;
  undefined1 auVar14 [16];
  long lStack_50;
  SQObject _this;
  
  if (this->_state == eRunning) {
    s = "resuming active generator";
  }
  else {
    if (this->_state != eDead) {
      uVar12 = (long)dest - (long)((v->_stack)._vals + v->_stackbase) >> 4;
      if (0xff < uVar12) {
        __assert_fail("target>=0 && target<=255",
                      "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/deps/squirrel/squirrel/sqobject.cpp"
                      ,0xab,"bool SQGenerator::Resume(SQVM *, SQObjectPtr &)");
      }
      SVar3 = (this->_stack)._size;
      lVar13 = v->_top;
      bVar9 = SQVM::EnterFrame(v,lVar13,lVar13 + SVar3,false);
      if (!bVar9) {
        return false;
      }
      pCVar4 = v->ci;
      pCVar4->_generator = this;
      pCVar4->_target = (SQInt32)uVar12;
      SQObjectPtr::operator=(&pCVar4->_closure,&(this->_ci)._closure);
      pCVar4 = v->ci;
      pSVar7 = (this->_ci)._literals;
      pCVar4->_ip = (this->_ci)._ip;
      pCVar4->_literals = pSVar7;
      pCVar4->_ncalls = (this->_ci)._ncalls;
      iVar10 = (this->_ci)._etraps;
      pCVar4->_etraps = iVar10;
      pCVar4->_root = (this->_ci)._root;
      auVar14._8_4_ = (int)lVar13;
      auVar14._0_8_ = lVar13;
      auVar14._12_4_ = (int)((ulong)lVar13 >> 0x20);
      for (lVar11 = 0; lVar11 < iVar10; lVar11 = lVar11 + 1) {
        sqvector<SQExceptionTrap>::push_back
                  (&v->_etraps,(this->_etraps)._vals + ((this->_etraps)._size - 1));
        pSVar1 = &(this->_etraps)._size;
        *pSVar1 = *pSVar1 - 1;
        pSVar5 = (v->_etraps)._vals;
        SVar6 = (v->_etraps)._size;
        pSVar2 = pSVar5 + (SVar6 - 1);
        lVar8 = pSVar2->_stacksize;
        lStack_50 = auVar14._8_8_;
        pSVar5 = pSVar5 + (SVar6 - 1);
        pSVar5->_stackbase = pSVar2->_stackbase + lVar13;
        pSVar5->_stacksize = lVar8 + lStack_50;
        iVar10 = (this->_ci)._etraps;
      }
      pSVar7 = (this->_stack)._vals;
      _this._type = (pSVar7->super_SQObject)._type;
      _this._4_4_ = *(undefined4 *)&(pSVar7->super_SQObject).field_0x4;
      _this._unVal = (SQObjectValue)(pSVar7->super_SQObject)._unVal.pWeakRef;
      obj = &(_this._unVal.pWeakRef)->_obj;
      if (_this._type != OT_WEAKREF) {
        obj = &_this;
      }
      SQObjectPtr::operator=((v->_stack)._vals + v->_stackbase,obj);
      lVar11 = 0x10;
      for (lVar13 = 1; lVar13 < (long)SVar3; lVar13 = lVar13 + 1) {
        SQObjectPtr::operator=
                  ((SQObjectPtr *)
                   ((long)&(v->_stack)._vals[v->_stackbase].super_SQObject._type + lVar11),
                   (SQObjectPtr *)((long)&(((this->_stack)._vals)->super_SQObject)._type + lVar11));
        SQObjectPtr::Null((SQObjectPtr *)
                          ((long)&(((this->_stack)._vals)->super_SQObject)._type + lVar11));
        lVar11 = lVar11 + 0x10;
      }
      this->_state = eRunning;
      if (v->_debughook != false) {
        SQVM::CallDebugHook(v,99,0);
      }
      return true;
    }
    s = "resuming dead generator";
  }
  SQVM::Raise_Error(v,s);
  return false;
}

Assistant:

bool SQGenerator::Resume(SQVM *v,SQObjectPtr &dest)
{
    if(_state==eDead){ v->Raise_Error(_SC("resuming dead generator")); return false; }
    if(_state==eRunning){ v->Raise_Error(_SC("resuming active generator")); return false; }
    SQInteger size = _stack.size();
    SQInteger target = &dest - &(v->_stack._vals[v->_stackbase]);
    assert(target>=0 && target<=255);
    SQInteger newbase = v->_top;
    if(!v->EnterFrame(v->_top, v->_top + size, false))
        return false;
    v->ci->_generator   = this;
    v->ci->_target      = (SQInt32)target;
    v->ci->_closure     = _ci._closure;
    v->ci->_ip          = _ci._ip;
    v->ci->_literals    = _ci._literals;
    v->ci->_ncalls      = _ci._ncalls;
    v->ci->_etraps      = _ci._etraps;
    v->ci->_root        = _ci._root;


    for(SQInteger i=0;i<_ci._etraps;i++) {
        v->_etraps.push_back(_etraps.top());
        _etraps.pop_back();
        SQExceptionTrap &et = v->_etraps.back();
        // restore absolute stack base and size
        et._stackbase += newbase;
        et._stacksize += newbase;
    }
    SQObject _this = _stack._vals[0];
    v->_stack[v->_stackbase] = sq_type(_this) == OT_WEAKREF ? _weakref(_this)->_obj : _this;

    for(SQInteger n = 1; n<size; n++) {
        v->_stack[v->_stackbase+n] = _stack._vals[n];
        _stack._vals[n].Null();
    }

    _state=eRunning;
    if (v->_debughook)
        v->CallDebugHook(_SC('c'));

    return true;
}